

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageNextXrEnumeratePersistedSpatialAnchorNamesMSFT
                   (XrSpatialAnchorStoreConnectionMSFT spatialAnchorStore,
                   uint32_t spatialAnchorNameCapacityInput,uint32_t *spatialAnchorNameCountOutput,
                   XrSpatialAnchorPersistenceNameMSFT *spatialAnchorNames)

{
  XrResult XVar1;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar2;
  
  pVar2 = HandleInfo<XrSpatialAnchorStoreConnectionMSFT_T_*>::getWithInstanceInfo
                    (&g_spatialanchorstoreconnectionmsft_info,spatialAnchorStore);
  XVar1 = (*(pVar2.second)->dispatch_table->EnumeratePersistedSpatialAnchorNamesMSFT)
                    (spatialAnchorStore,spatialAnchorNameCapacityInput,spatialAnchorNameCountOutput,
                     spatialAnchorNames);
  return XVar1;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL GenValidUsageNextXrEnumeratePersistedSpatialAnchorNamesMSFT(
    XrSpatialAnchorStoreConnectionMSFT spatialAnchorStore,
    uint32_t spatialAnchorNameCapacityInput,
    uint32_t* spatialAnchorNameCountOutput,
    XrSpatialAnchorPersistenceNameMSFT* spatialAnchorNames) {
    XrResult result = XR_SUCCESS;
    try {
        auto info_with_instance = g_spatialanchorstoreconnectionmsft_info.getWithInstanceInfo(spatialAnchorStore);
        GenValidUsageXrHandleInfo *gen_spatialanchorstoreconnectionmsft_info = info_with_instance.first;
        (void)gen_spatialanchorstoreconnectionmsft_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        result = gen_instance_info->dispatch_table->EnumeratePersistedSpatialAnchorNamesMSFT(spatialAnchorStore, spatialAnchorNameCapacityInput, spatialAnchorNameCountOutput, spatialAnchorNames);
    } catch (...) {
        result = XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}